

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::NormalGetRealName
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  string *str;
  Names local_230;
  Names local_170;
  cmAlphaNum local_a0;
  cmAlphaNum local_70;
  undefined1 local_40 [8];
  string msg;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  msg.field_2._8_8_ = config;
  bVar1 = IsImported(this);
  if (bVar1) {
    cmAlphaNum::cmAlphaNum(&local_70,"NormalGetRealName called on imported target: ");
    str = GetName_abi_cxx11_(this);
    cmAlphaNum::cmAlphaNum(&local_a0,str);
    cmStrCat<>((string *)local_40,&local_70,&local_a0);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  TVar2 = GetType(this);
  if (TVar2 == EXECUTABLE) {
    GetExecutableNames(&local_170,this,(string *)msg.field_2._8_8_);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_170.Real);
    Names::~Names(&local_170);
  }
  else {
    GetLibraryNames(&local_230,this,(string *)msg.field_2._8_8_);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_230.Real);
    Names::~Names(&local_230);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::NormalGetRealName(
  const std::string& config) const
{
  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = cmStrCat("NormalGetRealName called on imported target: ",
                               this->GetName());
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
  }

  if (this->GetType() == cmStateEnums::EXECUTABLE) {
    // Compute the real name that will be built.
    return this->GetExecutableNames(config).Real;
  }
  // Compute the real name that will be built.
  return this->GetLibraryNames(config).Real;
}